

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

size_t __thiscall flexbuffers::Builder::Key(Builder *this,char *str,size_t len)

{
  bool bVar1;
  reference puVar2;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar3;
  Value local_58;
  _Base_ptr local_48;
  undefined1 local_40;
  _Self local_38;
  _Self local_30;
  iterator it;
  size_type_conflict sloc;
  size_t len_local;
  char *str_local;
  Builder *this_local;
  
  it._M_node = (_Base_ptr)
               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buf_);
  WriteBytes(this,str,len + 1);
  if ((this->flags_ & BUILDER_FLAG_SHARE_KEYS) != BUILDER_FLAG_NONE) {
    local_30._M_node =
         (_Base_ptr)
         std::
         set<unsigned_long,_flexbuffers::Builder::KeyOffsetCompare,_std::allocator<unsigned_long>_>
         ::find(&this->key_pool,(key_type *)&it);
    local_38._M_node =
         (_Base_ptr)
         std::
         set<unsigned_long,_flexbuffers::Builder::KeyOffsetCompare,_std::allocator<unsigned_long>_>
         ::end(&this->key_pool);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (bVar1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->buf_,(size_type_conflict)it._M_node);
      puVar2 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&local_30);
      it._M_node = (_Base_ptr)*puVar2;
    }
    else {
      pVar3 = std::
              set<unsigned_long,_flexbuffers::Builder::KeyOffsetCompare,_std::allocator<unsigned_long>_>
              ::insert(&this->key_pool,(value_type_conflict3 *)&it);
      local_48 = (_Base_ptr)pVar3.first._M_node;
      local_40 = pVar3.second;
    }
  }
  Value::Value(&local_58,(uint64_t)it._M_node,FBT_KEY,BIT_WIDTH_8);
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::push_back
            (&this->stack_,&local_58);
  return (size_t)it._M_node;
}

Assistant:

size_t Key(const char *str, size_t len) {
    auto sloc = buf_.size();
    WriteBytes(str, len + 1);
    if (flags_ & BUILDER_FLAG_SHARE_KEYS) {
      auto it = key_pool.find(sloc);
      if (it != key_pool.end()) {
        // Already in the buffer. Remove key we just serialized, and use
        // existing offset instead.
        buf_.resize(sloc);
        sloc = *it;
      } else {
        key_pool.insert(sloc);
      }
    }
    stack_.push_back(Value(static_cast<uint64_t>(sloc), FBT_KEY, BIT_WIDTH_8));
    return sloc;
  }